

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_UnknownShortOption_Test::OptionParser_UnknownShortOption_Test
          (OptionParser_UnknownShortOption_Test *this)

{
  OptionParser_UnknownShortOption_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__OptionParser_UnknownShortOption_Test_003f55f0;
  return;
}

Assistant:

TEST(OptionParser, UnknownShortOption) {
  std::string error;
  OptionParser parser("prog", "desc");
  parser.SetErrorCallback([&](const char* msg) { error = msg; });
  const char* args[] = {"prog name", "-f"};
  parser.Parse(2, const_cast<char**>(args));
  EXPECT_EQ(error, "prog: unknown option '-f'" ERROR_ENDING);
}